

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

void __thiscall CVmObjBigNum::set_ieee754_value(CVmObjBigNum *this,char *buf,int bits)

{
  ushort *puVar1;
  ulong uVar2;
  int iVar3;
  char *pcVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong *ext1;
  ulong *new_ext;
  ulong *puVar10;
  ieee754 val;
  char t3buf [42];
  char t1 [42];
  char t2buf [42];
  ieee754 local_f0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined2 uStack_b0;
  undefined6 local_ae;
  undefined2 uStack_a8;
  undefined8 uStack_a6;
  ulong local_98 [3];
  undefined2 uStack_80;
  undefined6 local_7e;
  undefined2 uStack_78;
  undefined8 uStack_76;
  ulong local_68 [3];
  undefined2 uStack_50;
  undefined6 local_4e;
  undefined2 uStack_48;
  undefined8 uStack_46;
  
  ieee754::ieee754(&local_f0,buf,bits);
  if (local_f0.bytes < 2) {
LAB_0026a67c:
    if ((local_f0.buf[(int)(local_f0.bytes - 1U)] & 0x7f) != 0) goto LAB_0026a689;
    puVar1 = (ushort *)(this->super_CVmObject).ext_;
    puVar1[1] = 1;
    *(byte *)(puVar1 + 2) = (byte)puVar1[2] & 0xf0 | 8;
    memset((void *)((long)puVar1 + 5),0,(ulong)(*puVar1 + 1 >> 1));
  }
  else {
    uVar8 = 0;
    iVar9 = 0;
    do {
      iVar9 = iVar9 + (uint)local_f0.buf[uVar8];
      uVar8 = uVar8 + 1;
    } while (local_f0.bytes - 1U != uVar8);
    if (iVar9 == 0) goto LAB_0026a67c;
LAB_0026a689:
    iVar9 = ieee754::is_nan(&local_f0);
    if (iVar9 != 0) {
      pcVar4 = (this->super_CVmObject).ext_;
      bVar5 = pcVar4[4] & 0xf9U | 2;
      goto LAB_0026a70c;
    }
    iVar9 = ieee754::is_infinity(&local_f0);
    if (iVar9 == 0) {
      if (local_f0.bits == 0x10) {
        uVar6 = 6;
      }
      else if (local_f0.bits == 0x20) {
        uVar6 = 10;
      }
      else if (local_f0.bits == 0x40) {
        uVar6 = 0x13;
      }
      else {
        uVar6 = 2;
        if (local_f0.bits == 0x80) {
          uVar6 = 0x25;
        }
      }
      local_98[1] = 0;
      uStack_78 = 0;
      uStack_76 = 0;
      local_98[2] = 0;
      uStack_80 = 0;
      local_7e = 0;
      bVar5 = (byte)uVar6;
      local_98[0] = (ulong)bVar5;
      local_68[1] = 0;
      uStack_48 = 0;
      uStack_46 = 0;
      local_68[2] = 0;
      uStack_50 = 0;
      local_4e = 0;
      local_68[0] = (ulong)bVar5;
      uStack_c0 = 0;
      uStack_a8 = 0;
      uStack_a6 = 0;
      uStack_b8 = 0;
      uStack_b0 = 0;
      local_ae = 0;
      local_c8 = (ulong)bVar5;
      pcVar4 = cache_ln2((ulong)uVar6);
      iVar9 = ieee754::get_raw_exp(&local_f0);
      set_int_val((char *)local_98,(long)iVar9 - (long)local_f0.ebias);
      compute_prod_into((char *)local_68,(char *)local_98,pcVar4);
      compute_exp_into((char *)local_98,(char *)local_68);
      uVar8 = local_c8;
      if ((int)((long)iVar9 - (long)local_f0.ebias) < local_f0.emin) {
        local_c8._0_4_ = CONCAT22(1,(ushort)local_c8);
        local_c8._4_1_ = SUB81(uVar8,4);
        local_c8._5_3_ = SUB83(uVar8,5);
        uVar8 = CONCAT35(local_c8._5_3_,CONCAT14(local_c8._4_1_,(undefined4)local_c8)) &
                0xfffffff0ffffffff;
        local_c8 = uVar8 | 0x800000000;
        uVar2 = local_c8;
        local_c8._0_2_ = (ushort)uVar8;
        uVar6 = (uint)(ushort)local_c8;
        local_c8 = uVar2;
        memset((void *)((long)&local_c8 + 5),0,(ulong)(uVar6 + 1 >> 1));
        mul_by_long((char *)local_98,2);
      }
      else {
        copy_val((char *)&local_c8,(char *)local_98,0);
      }
      if (local_f0.mbits < 1) {
        ext1 = &local_c8;
      }
      else {
        ext1 = &local_c8;
        iVar9 = 0;
        new_ext = local_68;
        do {
          div_by_long((char *)local_98,2,(unsigned_long *)0x0);
          iVar7 = local_f0.ebits + iVar9 + 1;
          iVar3 = local_f0.ebits + iVar9 + 8;
          if (-1 < iVar7) {
            iVar3 = iVar7;
          }
          puVar10 = new_ext;
          if ((local_f0.buf[~(iVar3 >> 3) + local_f0.bytes] &
              (byte)(1 << (7 - ((char)iVar7 - ((byte)iVar3 & 0xf8)) & 0x1f))) != 0) {
            compute_sum_into((char *)new_ext,(char *)ext1,(char *)local_98);
            puVar10 = ext1;
            ext1 = new_ext;
          }
          iVar9 = iVar9 + 1;
          new_ext = puVar10;
        } while (iVar9 < local_f0.mbits);
      }
      *(byte *)((long)ext1 + 4) =
           local_f0.buf[(long)local_f0.bytes + -1] >> 7 | *(byte *)((long)ext1 + 4) & 0xfe;
      normalize((char *)ext1);
      copy_val((this->super_CVmObject).ext_,(char *)ext1,1);
      return;
    }
    pcVar4 = (this->super_CVmObject).ext_;
    pcVar4[4] = pcVar4[4] & 0xf9U | 4;
  }
  pcVar4 = (this->super_CVmObject).ext_;
  if ((char)local_f0.buf[(long)local_f0.bytes + -1] < '\0') {
    bVar5 = pcVar4[4] | 1;
  }
  else {
    bVar5 = pcVar4[4] & 0xfe;
  }
LAB_0026a70c:
  pcVar4[4] = bVar5;
  return;
}

Assistant:

void CVmObjBigNum::set_ieee754_value(VMG_ const char *buf, int bits)
{
    /* set up the buffer descriptor */
    ieee754 val((char *)buf, bits);

    /* check for special values */
    if (val.is_zero())
    {
        set_zero(ext_);
        set_neg(ext_, val.get_sign());
        return;
    }
    else if (val.is_nan())
    {
        set_type(ext_, VMBN_T_NAN);
        return;
    }
    else if (val.is_infinity())
    {
        set_type(ext_, VMBN_T_INF);
        set_neg(ext_, val.get_sign());
        return;
    }

    /* 
     *   figure the precision for our intermediate calculations based on the
     *   precision of the source format in decimal digits 
     */
    int prec = val.decimal_digits() + 2;

    /* 
     *   Set up some registers for intermediate calculations.  We don't have
     *   to allocate these since we know the upper bound to the precision
     *   we'll need (namely 35+2 for the 128-bit type).  
     */
    char t1[5+37] = { (char)prec, 0, 0, 0, 0 };
    char t2buf[5+37] = { (char)prec, 0, 0, 0, 0 }, *t2 = t2buf;
    char t3buf[5+37] = { (char)prec, 0, 0, 0, 0 }, *t3 = t3buf;

    /*
     *   The IEEE value is represented as A * 2^B, for some non-zero value of
     *   A.  If the exponent is emin-1, A is represented as 0.bbbbb, where
     *   the b's are bits of the mantissa.  For any other exponent, A is
     *   represented as 1.bbbbb.  To compute our value, then, start with 2^B
     *   in register t1 and zero in the accumulator.  If the leading bit is 1
     *   (exponent >= emin), add r1 to the accumulator.  Divide t1 by 2 and
     *   loop: if the current bit is set, add t1 to the accumulator.  Repeat
     *   for each bit of the mantissa.  
     */
    
    /* calculate t1 = 2^B = e^(B*ln2) */
    const char *ln2 = cache_ln2(prec);
    int e = val.get_exp();
    set_int_val(t1, e);
    compute_prod_into(t2, t1, ln2);
    compute_exp_into(t1, t2);

    /* 
     *   If b > emin-1, there's an implied 1 bit for the whole part.  If b ==
     *   emin-1, we have a subnormal number, meaning that the implied lead
     *   bit is 0, and the actual exponent is val.emin.  
     */
    if (e > val.emin - 1)
    {
        /* normalized - add the implied leading "1" bit */
        copy_val(t3, t1, FALSE);
    }
    else
    {
        /* 
         *   subnormal - the implied leading bit is "0", but the actual
         *   exponent value is emin - one higher than it appears
         */
        set_zero(t3);
        mul_by_long(t1, 2);
    }

    /* add each bit of the mantissa */
    for (int i = 0 ; i < val.mbits ; ++i)
    {
        /* divide the power-of-two multiplier by 2 for the next lower place */
        div_by_long(t1, 2);

        /* if this mantissa bit is 1, add t1 to the accumulator */
        if (val.get_mbit(i))
        {
            /* t2 <- acc + power of two */
            compute_sum_into(t2, t3, t1);

            /* swap t2 and t3 so that t3 is the accumulator again */
            char *ttmp = t3; t3 = t2; t2 = ttmp;
        }
    }

    /* set the sign and normalize the value */
    set_neg(t3, val.get_sign());
    normalize(t3);

    /* copy the result into our extension */
    copy_val(ext_, t3, TRUE);
}